

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitSwitch(BinaryInstWriter *this,Switch *curr)

{
  bool bVar1;
  uint uVar2;
  BufferWithRandomAccess *pBVar3;
  size_t sVar4;
  ArenaVector<wasm::Name> *this_00;
  Name *pNVar5;
  U32LEB local_74;
  size_t local_70;
  char *local_68;
  U32LEB local_5c;
  size_t local_58;
  Name target;
  Iterator __end1;
  Iterator __begin1;
  ArenaVector<wasm::Name> *__range1;
  Switch *local_18;
  Switch *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (Switch *)this;
  pBVar3 = BufferWithRandomAccess::operator<<(this->o,'\x0e');
  sVar4 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                    (&(local_18->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>
                    );
  LEB<unsigned_int,_unsigned_char>::LEB
            ((LEB<unsigned_int,_unsigned_char> *)((long)&__range1 + 4),(uint)sVar4);
  BufferWithRandomAccess::operator<<(pBVar3,__range1._4_4_);
  this_00 = &local_18->targets;
  join_0x00000010_0x00000000_ =
       ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::begin
                 (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
  join_0x00000010_0x00000000_ =
       ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::end
                 (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
  while( true ) {
    bVar1 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator!=
                      ((Iterator *)&__end1.index,(Iterator *)&target.super_IString.str._M_str);
    if (!bVar1) break;
    pNVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator*
                       ((Iterator *)&__end1.index);
    local_70 = (pNVar5->super_IString).str._M_len;
    local_68 = (pNVar5->super_IString).str._M_str;
    pBVar3 = this->o;
    local_58 = local_70;
    target.super_IString.str._M_len = (size_t)local_68;
    uVar2 = getBreakIndex(this,(Name)(pNVar5->super_IString).str);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_5c,uVar2);
    BufferWithRandomAccess::operator<<(pBVar3,local_5c);
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator++
              ((Iterator *)&__end1.index);
  }
  pBVar3 = this->o;
  uVar2 = getBreakIndex(this,(Name)(local_18->default_).super_IString.str);
  LEB<unsigned_int,_unsigned_char>::LEB(&local_74,uVar2);
  BufferWithRandomAccess::operator<<(pBVar3,local_74);
  return;
}

Assistant:

void BinaryInstWriter::visitSwitch(Switch* curr) {
  o << int8_t(BinaryConsts::BrTable) << U32LEB(curr->targets.size());
  for (auto target : curr->targets) {
    o << U32LEB(getBreakIndex(target));
  }
  o << U32LEB(getBreakIndex(curr->default_));
}